

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banman.cpp
# Opt level: O0

void __thiscall
BanMan::Ban(BanMan *this,CSubNet *sub_net,int64_t ban_time_offset,bool since_unix_epoch)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  long lVar4;
  mapped_type *pmVar5;
  byte in_CL;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_RDX;
  key_type *in_RDI;
  long in_FS_OFFSET;
  bool normalized_since_unix_epoch;
  int64_t normalized_ban_time_offset;
  CBanEntry ban_entry;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock9;
  CBanEntry *in_stack_ffffffffffffff68;
  long local_80;
  undefined4 in_stack_ffffffffffffff90;
  uint uVar6;
  undefined4 in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined8 local_30;
  int64_t local_28;
  BanMan *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = in_CL & 1;
  GetTime();
  CBanEntry::CBanEntry(in_stack_ffffffffffffff68,0x8b1c7f);
  if ((long)in_RDX < 1) {
    in_RDX = *(UniqueLock<AnnotatedMixin<std::mutex>_> **)&in_RDI[3].network.m_addr._size;
    bVar3 = 0;
  }
  if (bVar3 == 0) {
    local_80 = GetTime();
  }
  else {
    local_80 = 0;
  }
  lVar4 = (long)&(in_RDX->super_unique_lock)._M_device + local_80;
  MaybeCheckNotHeld((Mutex *)in_stack_ffffffffffffff68);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_RDX,(AnnotatedMixin<std::mutex> *)CONCAT17(bVar3,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff98,
             (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  pmVar5 = std::
           map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
           ::operator[]((map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
                         *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),in_RDI);
  bVar2 = lVar4 <= pmVar5->nBanUntil;
  if (!bVar2) {
    pmVar5 = std::
             map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
             ::operator[]((map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
                           *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),in_RDI);
    *(undefined8 *)pmVar5 = local_30;
    pmVar5->nCreateTime = local_28;
    pmVar5->nBanUntil = lVar4;
    in_RDI[1].netmask[0] = '\x01';
  }
  uVar6 = (uint)bVar2;
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffff68);
  if (uVar6 == 0) {
    if (*(long *)(in_RDI[1].netmask + 8) != 0) {
      CClientUIInterface::BannedListChanged((CClientUIInterface *)in_stack_ffffffffffffff68);
    }
    DumpBanlist(in_stack_ffffffffffffffe8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void BanMan::Ban(const CSubNet& sub_net, int64_t ban_time_offset, bool since_unix_epoch)
{
    CBanEntry ban_entry(GetTime());

    int64_t normalized_ban_time_offset = ban_time_offset;
    bool normalized_since_unix_epoch = since_unix_epoch;
    if (ban_time_offset <= 0) {
        normalized_ban_time_offset = m_default_ban_time;
        normalized_since_unix_epoch = false;
    }
    ban_entry.nBanUntil = (normalized_since_unix_epoch ? 0 : GetTime()) + normalized_ban_time_offset;

    {
        LOCK(m_banned_mutex);
        if (m_banned[sub_net].nBanUntil < ban_entry.nBanUntil) {
            m_banned[sub_net] = ban_entry;
            m_is_dirty = true;
        } else
            return;
    }
    if (m_client_interface) m_client_interface->BannedListChanged();

    //store banlist to disk immediately
    DumpBanlist();
}